

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

bool CleanAndRemoveFileName
               (wchar_t *dirty_path,bool bPathIncludesFileName,ON_wString *volume,
               ON_wString *clean_path,ON_wString *file_name)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  ulong string_length;
  wchar_t **local_b0;
  size_t len;
  size_t path_length;
  wchar_t *f;
  wchar_t *d;
  wchar_t *v;
  wchar_t *p;
  ON_wString local_40;
  ON_wString path;
  ON_wString *file_name_local;
  ON_wString *clean_path_local;
  ON_wString *volume_local;
  bool bPathIncludesFileName_local;
  wchar_t *dirty_path_local;
  
  path.m_s = (wchar_t *)file_name;
  ON_FileSystemPath::CleanPath((wchar_t *)&local_40);
  bVar1 = ON_wString::IsEmpty(&local_40);
  if (!bVar1) {
    if (!bPathIncludesFileName) {
      iVar2 = ON_wString::Length(&local_40);
      pwVar3 = ON_wString::operator[](&local_40,iVar2 + -1);
      bVar1 = IsDirSep(*pwVar3);
      if (!bVar1) {
        ON_wString::operator+=(&local_40,L'/');
      }
    }
    v = ON_wString::operator_cast_to_wchar_t_(&local_40);
    d = (wchar_t *)0x0;
    f = (wchar_t *)0x0;
    path_length = 0;
    if (bPathIncludesFileName) {
      local_b0 = (wchar_t **)&path_length;
    }
    else {
      local_b0 = (wchar_t **)0x0;
    }
    on_wsplitpath(v,&d,&f,local_b0,(wchar_t **)0x0);
    if ((f != (wchar_t *)0x0) && (*f != L'\0')) {
      ON_wString::operator=(clean_path,f);
      if (!bPathIncludesFileName) {
        if (path.m_s != (wchar_t *)0x0) {
          ON_wString::operator=((ON_wString *)path.m_s,&ON_wString::EmptyString);
        }
LAB_0060d999:
        dirty_path_local._7_1_ = true;
        goto LAB_0060d9f1;
      }
      if ((path_length != 0) && (*(int *)path_length != 0)) {
        iVar2 = ON_wString::Length(&local_40);
        if ((((long)iVar2 != 0) && (((v <= f && (f < path_length)) && (path_length < v + iVar2))))
           && (((bVar1 = IsDirSep(*(int *)(path_length - 4)), bVar1 &&
                (string_length = (long)(path_length - (long)f) >> 2, 1 < string_length)) &&
               (iVar2 = ON_wString::Length(clean_path), string_length < (ulong)(long)iVar2)))) {
          if (path.m_s != (wchar_t *)0x0) {
            ON_wString::operator=((ON_wString *)path.m_s,(wchar_t *)path_length);
          }
          ON_wString::SetLength(clean_path,string_length);
          goto LAB_0060d999;
        }
      }
    }
  }
  ON_wString::operator=(volume,&ON_wString::EmptyString);
  ON_wString::operator=(clean_path,&ON_wString::EmptyString);
  if (path.m_s != (wchar_t *)0x0) {
    ON_wString::operator=((ON_wString *)path.m_s,&ON_wString::EmptyString);
  }
  dirty_path_local._7_1_ = false;
LAB_0060d9f1:
  ON_wString::~ON_wString(&local_40);
  return dirty_path_local._7_1_;
}

Assistant:

static bool CleanAndRemoveFileName(
  const wchar_t* dirty_path,
  bool bPathIncludesFileName,
  ON_wString& volume,
  ON_wString& clean_path,
  ON_wString* file_name
  )
{
  ON_wString path = ON_FileSystemPath::CleanPath(dirty_path);
  for (;;)
  {
    if (path.IsEmpty())
      break;

    if (false == bPathIncludesFileName && false == IsDirSep(path[path.Length() - 1]))
      path += ON_FileSystemPath::DirectorySeparator;

    const wchar_t* p = static_cast<const wchar_t*>(path);
    const wchar_t* v = nullptr;
    const wchar_t* d = nullptr;
    const wchar_t* f = nullptr;
    on_wsplitpath(p, &v, &d, bPathIncludesFileName ? &f : nullptr, nullptr);

    if (nullptr == d || 0 == d[0])
      break;
    
    clean_path = d;

    if (bPathIncludesFileName)
    {
      // remove trailing file name from base_path.
      if (nullptr == f || 0 == f[0])
        break;
      const size_t path_length = (size_t)path.Length();
      if  ( path_length <= 0 )
        break;
      if (!(p <= d && d < f && f < p + path_length))
        break;
      if (!IsDirSep(f[-1]))
        break;
      size_t len = (f - d);
      if (len <= 1 || len >= (size_t)clean_path.Length())
        break;
      if ( nullptr != file_name )
        *file_name = f;
      clean_path.SetLength(len);
    }
    else
    {
      if ( nullptr != file_name )
        *file_name = ON_wString::EmptyString;
    }

    return true;
  }

  volume = ON_wString::EmptyString;
  clean_path = ON_wString::EmptyString;
  if ( nullptr != file_name )
    *file_name = ON_wString::EmptyString;
  return false;
}